

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall
picojson::default_parse_context::
parse_array_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (default_parse_context *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in,size_t param_2)

{
  bool bVar1;
  array *this_00;
  reference out;
  default_parse_context local_50;
  default_parse_context ctx;
  value local_38;
  array *local_28;
  array *a;
  size_t param_2_local;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  default_parse_context *this_local;
  
  a = (array *)param_2;
  param_2_local = (size_t)in;
  in_local = (input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this;
  this_00 = value::get<std::vector<picojson::value,std::allocator<picojson::value>>>(this->out_);
  local_28 = this_00;
  value::value(&local_38);
  std::vector<picojson::value,_std::allocator<picojson::value>_>::push_back(this_00,&local_38);
  value::~value(&local_38);
  out = std::vector<picojson::value,_std::allocator<picojson::value>_>::back(local_28);
  default_parse_context(&local_50,out);
  bVar1 = _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_50,
                     (input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
  return bVar1;
}

Assistant:

bool parse_array_item(input<Iter> &in, size_t) {
    array &a = out_->get<array>();
    a.push_back(value());
    default_parse_context ctx(&a.back());
    return _parse(ctx, in);
  }